

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

ImageOperandsMask __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::TranslateImageOperands
          (TGlslangToSpvTraverser *this,CoherentFlags *coherentFlags)

{
  ImageOperandsMask IVar1;
  ImageOperandsMask IVar2;
  Capability local_c;
  
  IVar1 = ImageOperandsMaskNone;
  if (this->glslangIntermediate->useVulkanMemoryModel == true) {
    IVar2 = (ImageOperandsMask)coherentFlags;
    IVar1 = ImageOperandsMakeTexelVisibleKHRMask|ImageOperandsMakeTexelAvailableKHRMask;
    if (((ulong)coherentFlags & 0xbf) == 0) {
      IVar1 = IVar2 & (ImageOperandsMinLodMask|ConstOffsets|ImageOperandsOffsetMask|ConstOffset|Grad
                       |ImageOperandsLodMask|Bias);
    }
    IVar1 = IVar2 << 4 & ImageOperandsVolatileTexelKHRMask |
            IVar2 << 4 & ImageOperandsNonPrivateTexelKHRMask | IVar1;
    if (((IVar2 >> 8 & 1) == 0) || ((this->builder).spvVersion < 0x10600)) {
      if (IVar1 == ImageOperandsMaskNone) {
        return ImageOperandsMaskNone;
      }
    }
    else {
      IVar1 = IVar1 | ImageOperandsNontemporalMask;
    }
    local_c = CapabilityVulkanMemoryModel;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&(this->builder).capabilities,&local_c);
  }
  return IVar1;
}

Assistant:

spv::ImageOperandsMask TGlslangToSpvTraverser::TranslateImageOperands(
    const spv::Builder::AccessChain::CoherentFlags &coherentFlags)
{
    spv::ImageOperandsMask mask = spv::ImageOperandsMaskNone;

    if (!glslangIntermediate->usingVulkanMemoryModel())
        return mask;

    if (coherentFlags.volatil ||
        coherentFlags.anyCoherent()) {
        mask = mask | spv::ImageOperandsMakeTexelAvailableKHRMask |
                      spv::ImageOperandsMakeTexelVisibleKHRMask;
    }
    if (coherentFlags.nonprivate) {
        mask = mask | spv::ImageOperandsNonPrivateTexelKHRMask;
    }
    if (coherentFlags.volatil) {
        mask = mask | spv::ImageOperandsVolatileTexelKHRMask;
    }
    if (coherentFlags.nontemporal && builder.getSpvVersion() >= spv::Spv_1_6) {
        mask = mask | spv::ImageOperandsNontemporalMask;
    }
    if (mask != spv::ImageOperandsMaskNone) {
        builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
    }

    return mask;
}